

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.h
# Opt level: O3

plain_range_sorted<CLocalizationDatabase::CString>
find_binary<plain_range_sorted<CLocalizationDatabase::CString>,CLocalizationDatabase::CString>
          (plain_range_sorted<CLocalizationDatabase::CString> range,CString value)

{
  undefined4 uVar1;
  undefined4 uVar2;
  long lVar3;
  CString value_00;
  undefined4 extraout_EAX;
  EVP_PKEY_CTX *in_RDX;
  long in_FS_OFFSET;
  undefined1 auVar4 [16];
  int iVar5;
  plain_range<CLocalizationDatabase::CString> pVar6;
  undefined8 uVar7;
  char *pcVar8;
  int iVar9;
  undefined4 in_stack_ffffffffffffffdc;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  uVar7 = *(undefined8 *)in_RDX;
  pcVar8 = (char *)0x0;
  iVar9 = 0;
  string_base<allocator_default<char>_>::copy
            ((string_base<allocator_default<char>_> *)&stack0xffffffffffffffd0,in_RDX + 8,in_RDX);
  value_00.m_Replacement.str = pcVar8;
  value_00.m_Hash = (int)uVar7;
  value_00.m_ContextHash = (int)((ulong)uVar7 >> 0x20);
  value_00.m_Replacement.length = iVar9;
  value_00.m_Replacement._12_4_ = in_stack_ffffffffffffffdc;
  pVar6 = (plain_range<CLocalizationDatabase::CString>)
          partition_binary<plain_range_sorted<CLocalizationDatabase::CString>,CLocalizationDatabase::CString>
                    (range,value_00);
  pVar6.begin = pVar6.begin;
  if (pcVar8 != (char *)0x0) {
    operator_delete__(pcVar8);
  }
  if (pVar6.begin < pVar6.end) {
    dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/base/tl/range.h"
                   ,0x96,1,"empty");
    uVar1 = (pVar6.begin)->m_Hash;
    uVar2 = (pVar6.begin)->m_ContextHash;
    iVar9 = -(uint)((int)*(undefined8 *)in_RDX == uVar1);
    iVar5 = -(uint)((int)((ulong)*(undefined8 *)in_RDX >> 0x20) == uVar2);
    auVar4._4_4_ = iVar9;
    auVar4._0_4_ = iVar9;
    auVar4._8_4_ = iVar5;
    auVar4._12_4_ = iVar5;
    iVar9 = movmskpd(extraout_EAX,auVar4);
    if (iVar9 != 3) {
      pVar6.begin = (CString *)0x0;
    }
    pVar6.end = pVar6.end;
    pVar6.begin = pVar6.begin;
    if (iVar9 != 3) {
      pVar6.end = (CString *)0x0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return (plain_range_sorted<CLocalizationDatabase::CString>)pVar6;
  }
  __stack_chk_fail();
}

Assistant:

R find_binary(R range, T value)
{
	range = partition_binary(range, value);
	if(range.empty()) return range;
	if(range.front() == value) return range;
	return R();
}